

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_wychang_2015.h
# Opt level: O3

void __thiscall CCIT<TTA>::PerformLabeling(CCIT<TTA> *this)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  char cVar4;
  int *piVar5;
  Mat1i *pMVar6;
  Mat1b *pMVar7;
  long lVar8;
  uint *puVar9;
  uint *puVar10;
  uint *puVar11;
  uint *puVar12;
  uint *puVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  undefined4 uVar30;
  int iVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  long lVar39;
  uint uVar40;
  uint uVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  bool bVar48;
  uint local_110;
  ulong local_100;
  long local_e8;
  long local_e0;
  long local_d8;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar5 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar5,piVar5[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar31 = *(int *)&pMVar6->field_0xc;
  lVar44 = (long)iVar31;
  uVar18 = *(uint *)&pMVar6->field_0x8;
  uVar29 = (ulong)uVar18;
  uVar3 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar3 >> 0x20) + 1) / 2) * (((int)uVar3 + 1) / 2) + 1);
  puVar9 = TTA::rtable_;
  *TTA::rtable_ = 0;
  puVar12 = TTA::tail_;
  puVar10 = TTA::next_;
  TTA::length_ = 1;
  if (0 < lVar44) {
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar45 = *(long *)&pMVar7->field_0x10;
    lVar28 = **(long **)&pMVar7->field_0x48 + lVar45;
    lVar27 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    iVar38 = 0;
    do {
      lVar46 = (long)iVar38;
      if (*(char *)(lVar45 + lVar46) == '\0') {
        lVar8 = lVar46 + 1;
        iVar15 = (int)lVar8;
        if ((iVar15 < iVar31) && (*(char *)(lVar45 + lVar8) != '\0')) {
LAB_001db285:
          uVar33 = (ulong)TTA::length_;
          puVar9[uVar33] = TTA::length_;
          puVar10[uVar33] = 0xffffffff;
          uVar33 = (ulong)TTA::length_;
          puVar12[uVar33] = TTA::length_;
          uVar40 = TTA::length_ + 1;
          *(uint *)(lVar27 + lVar46 * 4) = TTA::length_;
          TTA::length_ = uVar40;
          goto LAB_001db2ab;
        }
        if (1 < (int)uVar18) {
          if (*(char *)(lVar28 + lVar46) == '\0') {
            if ((iVar15 < iVar31) && (*(char *)(lVar28 + lVar8) != '\0')) goto LAB_001db285;
          }
          else {
            uVar33 = (ulong)TTA::length_;
            puVar9[uVar33] = TTA::length_;
            puVar10[uVar33] = 0xffffffff;
            uVar33 = (ulong)TTA::length_;
            puVar12[uVar33] = TTA::length_;
            uVar40 = TTA::length_ + 1;
            *(uint *)(lVar27 + lVar46 * 4) = TTA::length_;
            TTA::length_ = uVar40;
            if (iVar15 < iVar31) {
              cVar4 = *(char *)(lVar28 + lVar8);
              goto joined_r0x001db3cd;
            }
          }
        }
LAB_001db3eb:
        uVar32 = (ulong)(iVar38 + 2);
      }
      else {
        uVar33 = (ulong)TTA::length_;
        puVar9[uVar33] = TTA::length_;
        puVar10[uVar33] = 0xffffffff;
        uVar33 = (ulong)TTA::length_;
        puVar12[uVar33] = TTA::length_;
        uVar40 = TTA::length_ + 1;
        *(uint *)(lVar27 + lVar46 * 4) = TTA::length_;
        TTA::length_ = uVar40;
        lVar46 = lVar46 + 1;
        if (iVar31 <= (int)lVar46) goto LAB_001db3eb;
        if (*(char *)(lVar45 + lVar46) == '\0') {
          if (1 < (int)uVar18) {
            cVar4 = *(char *)(lVar28 + lVar46);
joined_r0x001db3cd:
            if (cVar4 != '\0') goto LAB_001db2ab;
          }
          goto LAB_001db3eb;
        }
LAB_001db2ab:
        puVar13 = TTA::tail_;
        puVar11 = TTA::next_;
        uVar40 = iVar38 + 2;
        uVar32 = (ulong)uVar40;
        if ((int)uVar40 < iVar31) {
          uVar32 = (ulong)(int)uVar40;
          iVar38 = iVar38 + 3;
          do {
            if (*(char *)(lVar45 + uVar32) == '\0') {
              if ((iVar38 < iVar31) && (*(char *)(lVar45 + iVar38) != '\0')) {
                if (((int)uVar18 < 2) || (*(char *)(lVar28 + uVar32) == '\0')) {
LAB_001db356:
                  uVar33 = (ulong)TTA::length_;
                  puVar9[uVar33] = TTA::length_;
                  puVar11[uVar33] = 0xffffffff;
                  uVar33 = (ulong)TTA::length_;
                  puVar13[uVar33] = TTA::length_;
                  TTA::length_ = TTA::length_ + 1;
                }
                *(int *)(lVar27 + uVar32 * 4) = (int)uVar33;
                goto LAB_001db379;
              }
              if (1 < (int)uVar18) {
                if (*(char *)(lVar28 + uVar32) == '\0') {
                  if ((iVar38 < iVar31) && (*(char *)(lVar28 + iVar38) != '\0')) goto LAB_001db356;
                }
                else {
                  *(int *)(lVar27 + uVar32 * 4) = (int)uVar33;
                  if (iVar38 < iVar31) goto LAB_001db339;
                }
              }
LAB_001db3d5:
              uVar32 = uVar32 + 2;
              break;
            }
            *(int *)(lVar27 + uVar32 * 4) = (int)uVar33;
            if (iVar31 <= iVar38) goto LAB_001db3d5;
            if (*(char *)(lVar45 + iVar38) == '\0') {
              if (1 < (int)uVar18) {
LAB_001db339:
                if (*(char *)(lVar28 + iVar38) != '\0') goto LAB_001db379;
              }
              goto LAB_001db3d5;
            }
LAB_001db379:
            uVar32 = uVar32 + 2;
            iVar38 = iVar38 + 2;
          } while ((long)uVar32 < lVar44);
        }
      }
      iVar38 = (int)uVar32;
    } while (iVar38 < iVar31);
  }
  if (2 < (int)uVar18) {
    local_100 = 2;
    local_d8 = 1;
    local_e0 = 3;
    local_e8 = 0;
    do {
      if (0 < iVar31) {
        pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar28 = *(long *)&pMVar7->field_0x10;
        lVar46 = **(long **)&pMVar7->field_0x48;
        lVar24 = lVar46 * local_100 + lVar28;
        lVar34 = lVar24 - lVar46;
        lVar25 = lVar24 + lVar46;
        lVar8 = *(long *)&pMVar6->field_0x10;
        lVar39 = **(long **)&pMVar6->field_0x48;
        lVar35 = lVar39 * local_100 + lVar8;
        lVar36 = lVar35 + lVar39 * -2;
        lVar45 = lVar34 + -1;
        lVar37 = lVar36 + -8;
        uVar32 = local_100 | 1;
        lVar27 = lVar34 + 1;
        uVar33 = 0;
        do {
          iVar38 = (int)uVar33;
          uVar19 = (ulong)iVar38;
          uVar43 = uVar19 + 1;
          iVar15 = (int)uVar43;
          if (*(char *)(lVar24 + uVar19) == '\0') {
            if ((iVar15 < iVar31) && (*(char *)(lVar24 + uVar43) != '\0')) {
              if (*(char *)(lVar34 + uVar43) == '\0') {
                if (*(char *)(lVar34 + uVar19) != '\0') {
                  uVar40 = *(uint *)(lVar36 + uVar19 * 4);
                  *(uint *)(lVar35 + uVar19 * 4) = uVar40;
                  goto LAB_001db7a2;
                }
LAB_001db7d1:
                if (((int)(uVar19 + 2) < iVar31) && (*(char *)(lVar34 + uVar19 + 2) != '\0')) {
                  uVar26 = (ulong)*(uint *)(lVar36 + 8 + uVar19 * 4);
                }
                else {
LAB_001db7ed:
                  uVar43 = (ulong)TTA::length_;
                  TTA::rtable_[uVar43] = TTA::length_;
                  TTA::next_[uVar43] = 0xffffffff;
                  uVar26 = (ulong)TTA::length_;
                  TTA::tail_[uVar26] = TTA::length_;
                  TTA::length_ = TTA::length_ + 1;
                }
              }
              else {
                uVar26 = (ulong)*(uint *)(lVar36 + uVar19 * 4);
              }
              *(int *)(lVar35 + uVar19 * 4) = (int)uVar26;
              bVar48 = true;
              goto LAB_001db837;
            }
            if (uVar32 < uVar29) {
              if (*(char *)(lVar25 + uVar19) == '\0') {
                if ((iVar15 < iVar31) && (*(char *)(lVar25 + uVar43) != '\0')) goto LAB_001db7ed;
              }
              else {
                uVar26 = (ulong)TTA::length_;
                TTA::rtable_[uVar26] = TTA::length_;
                TTA::next_[uVar26] = 0xffffffff;
                uVar26 = (ulong)TTA::length_;
                TTA::tail_[uVar26] = TTA::length_;
                uVar40 = TTA::length_ + 1;
                *(uint *)(lVar35 + uVar19 * 4) = TTA::length_;
                TTA::length_ = uVar40;
                if ((iVar15 < iVar31) && (bVar48 = true, *(char *)(lVar25 + uVar43) != '\0'))
                goto LAB_001db837;
              }
            }
LAB_001db755:
            uVar43 = (ulong)(iVar38 + 2);
          }
          else {
            if ((iVar15 < iVar31) && (*(char *)(lVar24 + uVar43) != '\0')) {
              if (*(char *)(lVar34 + uVar19) == '\0') {
                if (*(char *)(lVar34 + uVar43) == '\0') {
                  if ((iVar38 < 2) || (*(char *)(lVar45 + uVar19) == '\0')) goto LAB_001db7d1;
                  uVar40 = *(uint *)(lVar37 + uVar19 * 4);
                  *(uint *)(lVar35 + uVar19 * 4) = uVar40;
                  uVar19 = uVar33;
LAB_001db7a2:
                  uVar26 = (ulong)uVar40;
                  goto LAB_001db7a9;
                }
                uVar40 = *(uint *)(lVar36 + uVar19 * 4);
                uVar26 = (ulong)uVar40;
                *(uint *)(lVar35 + uVar19 * 4) = uVar40;
                bVar48 = true;
                if ((iVar38 < 2) || (*(char *)(lVar45 + uVar19) == '\0')) goto LAB_001db837;
                uVar40 = *(uint *)(lVar37 + uVar19 * 4);
LAB_001db7c2:
                bVar48 = true;
                TTA::Merge((uint)uVar26,uVar40);
              }
              else {
                uVar40 = *(uint *)(lVar36 + uVar19 * 4);
                uVar26 = (ulong)uVar40;
                *(uint *)(lVar35 + uVar19 * 4) = uVar40;
                bVar48 = true;
                if (*(char *)(lVar34 + uVar43) == '\0') {
LAB_001db7a9:
                  bVar48 = true;
                  if (((int)(uVar19 + 2) < iVar31) && (*(char *)(lVar34 + uVar19 + 2) != '\0')) {
                    uVar40 = *(uint *)(lVar36 + 8 + uVar19 * 4);
                    goto LAB_001db7c2;
                  }
                }
              }
            }
            else {
              if (*(char *)(lVar34 + uVar19) == '\0') {
                if ((iVar38 < 2) || (*(char *)(lVar45 + uVar19) == '\0')) {
                  if ((iVar15 < iVar31) && (*(char *)(lVar34 + uVar43) != '\0')) goto LAB_001db573;
                  uVar26 = (ulong)TTA::length_;
                  TTA::rtable_[uVar26] = TTA::length_;
                  TTA::next_[uVar26] = 0xffffffff;
                  uVar26 = (ulong)TTA::length_;
                  TTA::tail_[uVar26] = TTA::length_;
                  TTA::length_ = TTA::length_ + 1;
                  goto LAB_001db6cf;
                }
                uVar40 = *(uint *)(lVar37 + uVar19 * 4);
                uVar26 = (ulong)uVar40;
                *(uint *)(lVar35 + uVar19 * 4) = uVar40;
                if (iVar31 <= iVar15) goto LAB_001db755;
                if (*(char *)(lVar34 + (uVar43 & 0xffffffff)) != '\0') {
                  TTA::Merge(uVar40,*(uint *)(lVar36 + uVar19 * 4));
                }
              }
              else {
LAB_001db573:
                uVar26 = (ulong)*(uint *)(lVar36 + uVar19 * 4);
LAB_001db6cf:
                *(int *)(lVar35 + uVar19 * 4) = (int)uVar26;
              }
              if ((iVar31 <= iVar15) || (uVar29 <= uVar32)) goto LAB_001db755;
              bVar48 = *(char *)(lVar25 + uVar43) != '\0';
            }
LAB_001db837:
            uVar40 = iVar38 + 2;
            uVar43 = (ulong)uVar40;
            if ((bVar48) && ((int)uVar40 < iVar31)) {
              lVar42 = (long)(int)uVar40;
              lVar1 = lVar35 + lVar42 * 4;
              lVar20 = lVar46 * local_d8 + lVar28 + lVar42;
              lVar2 = lVar39 * local_e8 + lVar8 + lVar42 * 4;
              lVar21 = lVar46 * local_e0 + lVar28 + lVar42;
              lVar47 = 0;
              do {
                uVar43 = uVar33 + 3 + lVar47;
                uVar40 = (uint)uVar26;
                iVar17 = (int)uVar43;
                iVar15 = (int)lVar47;
                if (*(char *)(lVar24 + lVar42 + lVar47) == '\0') {
                  if ((iVar31 <= iVar17) ||
                     (lVar22 = (long)iVar17, *(char *)(lVar24 + lVar22) == '\0')) {
                    if (uVar32 < uVar29) {
                      if (*(char *)(lVar21 + lVar47) != '\0') {
                        *(uint *)(lVar1 + lVar47 * 4) = uVar40;
                        if (iVar31 <= iVar17) goto LAB_001dbc67;
                        goto LAB_001db9fe;
                      }
                      if ((iVar17 < iVar31) && (*(char *)(lVar25 + iVar17) != '\0')) {
LAB_001dba93:
                        uVar43 = (ulong)TTA::length_;
                        TTA::rtable_[uVar43] = TTA::length_;
                        TTA::next_[uVar43] = 0xffffffff;
                        uVar26 = (ulong)TTA::length_;
                        TTA::tail_[uVar26] = TTA::length_;
                        TTA::length_ = TTA::length_ + 1;
                        goto LAB_001dbae7;
                      }
                    }
                    goto LAB_001dbc67;
                  }
                  if ((uVar32 < uVar29) && (*(char *)(lVar21 + lVar47) != '\0')) {
                    *(uint *)(lVar1 + lVar47 * 4) = uVar40;
                    if (*(char *)(lVar34 + lVar22) == '\0') {
                      if (*(char *)(lVar20 + lVar47) != '\0') {
                        iVar17 = iVar38 + iVar15 + 4;
                        if ((iVar31 <= iVar17) || (*(char *)(lVar34 + iVar17) == '\0'))
                        goto LAB_001db9b1;
                        uVar16 = TTA::Merge(*(uint *)(lVar2 + lVar47 * 4),
                                            *(uint *)(lVar36 + (long)iVar17 * 4));
                        goto LAB_001db9ba;
                      }
                    }
                    else {
LAB_001db9b1:
                      uVar16 = *(uint *)(lVar2 + lVar47 * 4);
LAB_001db9ba:
                      TTA::Merge(uVar40,uVar16);
                    }
LAB_001dbc10:
                    iVar15 = iVar38 + iVar15 + 4;
                    if ((iVar15 < iVar31) &&
                       (uVar19 = (ulong)iVar15, *(char *)(lVar34 + uVar19) != '\0'))
                    goto LAB_001dbc2e;
                  }
                  else {
                    if (*(char *)(lVar34 + lVar22) == '\0') {
                      if (*(char *)(lVar20 + lVar47) != '\0') {
                        uVar40 = *(uint *)(lVar2 + lVar47 * 4);
                        uVar26 = (ulong)uVar40;
                        *(uint *)(lVar1 + lVar47 * 4) = uVar40;
                        goto LAB_001dbc10;
                      }
                      iVar15 = iVar38 + iVar15 + 4;
                      if ((iVar31 <= iVar15) || (*(char *)(lVar34 + iVar15) == '\0'))
                      goto LAB_001dba93;
                      uVar26 = (ulong)*(uint *)(lVar36 + (long)iVar15 * 4);
                    }
                    else {
                      uVar26 = (ulong)*(uint *)(lVar2 + lVar47 * 4);
                    }
LAB_001dbae7:
                    *(int *)(lVar1 + lVar47 * 4) = (int)uVar26;
                  }
                }
                else {
                  uVar19 = uVar33 + lVar47;
                  *(uint *)(lVar1 + lVar47 * 4) = uVar40;
                  iVar14 = (int)uVar19;
                  if ((iVar31 <= iVar17) || (*(char *)(lVar24 + iVar17) == '\0')) {
                    if (*(char *)(lVar20 + lVar47) == '\0') {
                      if ((-1 < iVar14) &&
                         (uVar19 = uVar19 & 0xffffffff, *(char *)(lVar27 + uVar19) != '\0')) {
                        if ((iVar17 < iVar31) && (*(char *)(lVar34 + (uVar43 & 0xffffffff)) != '\0')
                           ) {
                          uVar16 = TTA::Merge(*(uint *)(lVar36 + uVar19 * 4),
                                              *(uint *)(lVar2 + lVar47 * 4));
                        }
                        else {
                          uVar16 = *(uint *)(lVar36 + uVar19 * 4);
                        }
                        goto LAB_001db93f;
                      }
                      if (iVar31 <= iVar17) goto LAB_001dbc67;
                      if (*(char *)(lVar34 + iVar17) != '\0') goto LAB_001db936;
                    }
                    else {
LAB_001db936:
                      uVar16 = *(uint *)(lVar2 + lVar47 * 4);
LAB_001db93f:
                      TTA::Merge(uVar40,uVar16);
                    }
                    if ((iVar17 < iVar31) && (uVar32 < uVar29)) {
LAB_001db9fe:
                      if (*(char *)(lVar25 + iVar17) != '\0') goto LAB_001dbb41;
                    }
LAB_001dbc67:
                    uVar43 = lVar42 + lVar47 + 2;
                    goto LAB_001dbc73;
                  }
                  cVar4 = *(char *)(lVar34 + iVar17);
                  if (*(char *)(lVar20 + lVar47) == '\0') {
                    if (cVar4 != '\0') {
                      if ((iVar14 < 0) || (*(char *)(lVar27 + (uVar19 & 0xffffffff)) == '\0'))
                      goto LAB_001dbb2b;
                      uVar16 = *(uint *)(lVar36 + (uVar19 & 0xffffffff) * 4);
                      uVar23 = *(uint *)(lVar2 + lVar47 * 4);
                      goto LAB_001dbb1f;
                    }
                    if ((iVar14 < 0) ||
                       (uVar19 = uVar19 & 0xffffffff, *(char *)(lVar27 + uVar19) == '\0'))
                    goto LAB_001dbc10;
                    uVar23 = iVar38 + iVar15 + 4;
                    if (((int)uVar23 < iVar31) && (*(char *)(lVar34 + (ulong)uVar23) != '\0')) {
                      uVar16 = *(uint *)(lVar36 + uVar19 * 4);
                      uVar23 = *(uint *)(lVar36 + (ulong)uVar23 * 4);
                      goto LAB_001dbb1f;
                    }
LAB_001dbc2e:
                    uVar16 = *(uint *)(lVar36 + uVar19 * 4);
LAB_001dbb34:
                    uVar40 = (uint)uVar26;
                  }
                  else {
                    if (((cVar4 != '\0') || (iVar15 = iVar38 + iVar15 + 4, iVar31 <= iVar15)) ||
                       (*(char *)(lVar34 + iVar15) == '\0')) {
LAB_001dbb2b:
                      uVar16 = *(uint *)(lVar2 + lVar47 * 4);
                      goto LAB_001dbb34;
                    }
                    uVar16 = *(uint *)(lVar2 + lVar47 * 4);
                    uVar23 = *(uint *)(lVar36 + (long)iVar15 * 4);
LAB_001dbb1f:
                    uVar16 = TTA::Merge(uVar16,uVar23);
                  }
                  TTA::Merge(uVar40,uVar16);
                }
LAB_001dbb41:
                lVar22 = lVar42 + lVar47;
                lVar47 = lVar47 + 2;
              } while (lVar22 + 2 < lVar44);
              uVar43 = lVar42 + lVar47;
            }
          }
LAB_001dbc73:
          uVar33 = uVar43 & 0xffffffff;
        } while ((int)uVar43 < iVar31);
      }
      local_100 = local_100 + 2;
      local_d8 = local_d8 + 2;
      local_e8 = local_e8 + 2;
      local_e0 = local_e0 + 2;
    } while ((int)local_100 < (int)uVar18);
  }
  puVar9 = TTA::rtable_;
  uVar18 = 1;
  if (1 < TTA::length_) {
    uVar18 = 1;
    uVar29 = 1;
    do {
      if (uVar29 == puVar9[uVar29]) {
        uVar18 = uVar18 + 1;
        uVar40 = uVar18;
      }
      else {
        uVar40 = puVar9[puVar9[uVar29]];
      }
      puVar9[uVar29] = uVar40;
      uVar29 = uVar29 + 1;
    } while (uVar29 < TTA::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar18;
  puVar9 = TTA::rtable_;
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar18 = *(uint *)&pMVar6->field_0x8;
  uVar16 = uVar18 & 0xfffffffe;
  uVar40 = *(uint *)&pMVar6->field_0xc;
  local_110 = uVar40 & 0x80000001;
  uVar33 = (long)(int)uVar40 & 0xfffffffffffffffe;
  uVar29 = 0;
  iVar31 = (int)uVar33;
  if (0 < (int)uVar16) {
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar27 = *(long *)&pMVar7->field_0x10;
    lVar28 = **(long **)&pMVar7->field_0x48;
    lVar46 = *(long *)&pMVar6->field_0x10;
    lVar8 = **(long **)&pMVar6->field_0x48;
    lVar44 = lVar46 + lVar8;
    lVar45 = lVar27 + 1 + lVar28;
    lVar24 = lVar27 + 1;
    uVar32 = 0;
    lVar39 = lVar46;
    do {
      puVar10 = TTA::rtable_;
      lVar34 = lVar8 * uVar32 + lVar46;
      lVar25 = lVar34 + lVar8;
      if (iVar31 < 1) {
        uVar43 = 0;
      }
      else {
        uVar43 = 0;
        do {
          lVar35 = (long)*(int *)(lVar39 + uVar43 * 4);
          if (lVar35 < 1) {
            *(undefined8 *)(lVar39 + uVar43 * 4) = 0;
            uVar19 = uVar43 + 1;
            *(undefined4 *)(lVar44 + uVar43 * 4) = 0;
            uVar30 = 0;
          }
          else {
            uVar23 = puVar10[lVar35];
            uVar41 = uVar23;
            if (*(char *)(lVar24 + -1 + uVar43) == '\0') {
              uVar41 = 0;
            }
            *(uint *)(lVar39 + uVar43 * 4) = uVar41;
            uVar19 = uVar43 | 1;
            uVar41 = uVar23;
            if (*(char *)(lVar24 + uVar43) == '\0') {
              uVar41 = 0;
            }
            *(uint *)(lVar39 + 4 + uVar43 * 4) = uVar41;
            uVar41 = uVar23;
            if (*(char *)(lVar45 + -1 + uVar43) == '\0') {
              uVar41 = 0;
            }
            *(uint *)(lVar44 + uVar43 * 4) = uVar41;
            uVar26 = (ulong)uVar23;
            if (*(char *)(lVar45 + uVar43) == '\0') {
              uVar26 = uVar29;
            }
            uVar30 = (undefined4)uVar26;
          }
          *(undefined4 *)(lVar25 + uVar19 * 4) = uVar30;
          uVar43 = uVar43 + 2;
        } while ((long)uVar43 < (long)uVar33);
      }
      if (local_110 == 1) {
        lVar35 = (long)*(int *)(lVar34 + uVar43 * 4);
        if (lVar35 < 1) {
          *(undefined4 *)(lVar34 + uVar43 * 4) = 0;
          *(undefined4 *)(lVar25 + uVar43 * 4) = 0;
        }
        else {
          lVar36 = lVar28 * uVar32 + lVar27;
          uVar23 = puVar9[lVar35];
          uVar19 = (ulong)uVar23;
          if (*(char *)(lVar36 + uVar43) == '\0') {
            uVar19 = uVar29;
          }
          *(int *)(lVar34 + uVar43 * 4) = (int)uVar19;
          if (*(char *)(lVar36 + lVar28 + uVar43) == '\0') {
            *(undefined4 *)(lVar25 + uVar43 * 4) = 0;
          }
          else {
            *(uint *)(lVar25 + uVar43 * 4) = uVar23;
          }
        }
      }
      uVar32 = uVar32 + 2;
      lVar44 = lVar44 + lVar8 * 2;
      lVar45 = lVar45 + lVar28 * 2;
      lVar24 = lVar24 + lVar28 * 2;
      lVar39 = lVar39 + lVar8 * 2;
    } while (uVar32 < uVar16);
    uVar29 = uVar32 & 0xffffffff;
  }
  puVar9 = TTA::rtable_;
  if ((uVar18 & 0x80000001) == 1) {
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    lVar44 = *(long *)&pMVar7->field_0x10;
    lVar28 = **(long **)&pMVar7->field_0x48 * uVar29;
    lVar45 = *(long *)&pMVar6->field_0x10;
    lVar27 = uVar29 * **(long **)&pMVar6->field_0x48;
    if (iVar31 < 1) {
      uVar29 = 0;
    }
    else {
      lVar46 = lVar28 + lVar44;
      lVar8 = lVar27 + lVar45;
      uVar29 = 0;
      do {
        lVar39 = (long)*(int *)(lVar8 + uVar29 * 4);
        if (lVar39 < 1) {
          *(undefined8 *)(lVar8 + uVar29 * 4) = 0;
        }
        else {
          uVar18 = puVar9[lVar39];
          uVar16 = uVar18;
          if (*(char *)(lVar46 + uVar29) == '\0') {
            uVar16 = 0;
          }
          *(uint *)(lVar8 + uVar29 * 4) = uVar16;
          if (*(char *)(lVar46 + 1 + uVar29) == '\0') {
            *(undefined4 *)(lVar8 + 4 + uVar29 * 4) = 0;
          }
          else {
            *(uint *)(lVar8 + 4 + uVar29 * 4) = uVar18;
          }
        }
        uVar29 = uVar29 + 2;
      } while (uVar29 < ((long)(int)uVar40 & 0xfffffffeU));
    }
    if (local_110 == 1) {
      lVar45 = lVar45 + lVar27;
      lVar27 = (long)*(int *)(lVar45 + uVar29 * 4);
      uVar18 = 0;
      if ((0 < lVar27) && (uVar18 = 0, *(char *)(lVar44 + lVar28 + uVar29) != '\0')) {
        uVar18 = TTA::rtable_[lVar27];
      }
      *(uint *)(lVar45 + uVar29 * 4) = uVar18;
    }
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0);

        int w = img_labels_.cols;
        int h = img_labels_.rows;

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        int lx, u, v, k;

#define CONDITION_B1 img_row[x] > 0 
#define CONDITION_B2 x+1<w && img_row[x+1] > 0              // WRONG in the original code -> add missing condition 
#define CONDITION_B3 y+1<h && img_row_fol[x] > 0            // WRONG in the original code -> add missing condition
#define CONDITION_B4 x+1<w && y+1<h && img_row_fol[x+1] > 0 // WRONG in the original code -> add missing condition
#define CONDITION_U1 x-1>0 && img_row_prev[x-1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U2 img_row_prev[x] > 0
#define CONDITION_U3 x+1<w && img_row_prev[x+1] > 0         // WRONG in the original code -> add missing condition
#define CONDITION_U4 x+2<w && img_row_prev[x+2] > 0         // WRONG in the original code -> add missing condition
#define ASSIGN_S img_labels_row[x] = img_labels_row[x-2]
#define ASSIGN_P img_labels_row[x] = img_labels_row_prev_prev[x-2]
#define ASSIGN_Q img_labels_row[x] = img_labels_row_prev_prev[x]
#define ASSIGN_R img_labels_row[x] = img_labels_row_prev_prev[x+2]
#define ASSIGN_LX img_labels_row[x] = lx
#define LOAD_LX u = lx
#define LOAD_PU u = img_labels_row_prev_prev[x-2]
#define LOAD_PV v = img_labels_row_prev_prev[x-2]
#define LOAD_QU u = img_labels_row_prev_prev[x]
#define LOAD_QV v = img_labels_row_prev_prev[x]
#define LOAD_QK k = img_labels_row_prev_prev[x]
#define LOAD_RV v = img_labels_row_prev_prev[x+2]
#define LOAD_RK k = img_labels_row_prev_prev[x+2]
#define NEW_LABEL lx = img_labels_row[x] = LabelsSolver::NewLabel();
#define RESOLVE_2(u, v) LabelsSolver::Merge(u,v);
#define RESOLVE_3(u, v, k) LabelsSolver::Merge(u,LabelsSolver::Merge(v,k));

        bool nextprocedure2;

        int y = 0; // Extract from the first for
        const unsigned char* const img_row = img_.ptr<unsigned char>(y);
        const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
        unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);

        // Process first two rows
        for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree_0.inc.h"

        }

        for (int y = 2; y < h; y += 2) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(y);
            unsigned int* const img_labels_row_prev_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
            for (int x = 0; x < w; x += 2) {

#include "labeling_wychang_2015_tree.inc.h"

            }
        }

        // Second scan (changed with better performing strategy to handle odd rows and columns)
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef CONDITION_B1 
#undef CONDITION_B2 
#undef CONDITION_B3 
#undef CONDITION_B4 
#undef CONDITION_U1 
#undef CONDITION_U2 
#undef CONDITION_U3 
#undef CONDITION_U4 
#undef ASSIGN_S
#undef ASSIGN_P
#undef ASSIGN_Q
#undef ASSIGN_R
#undef ASSIGN_LX 
#undef LOAD_LX 
#undef LOAD_PU 
#undef LOAD_PV 
#undef LOAD_QU 
#undef LOAD_QV 
#undef LOAD_QK 
#undef LOAD_RV 
#undef LOAD_RK 
#undef NEW_LABEL
#undef RESOLVE_2
#undef RESOLVE_3
    }